

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Ant * __thiscall
Ant::updatePh(Ant *this,vector<Wall,_std::allocator<Wall>_> *walls,
             vector<Pheromone,_std::allocator<Pheromone>_> *pheromones,
             vector<Gate,_std::allocator<Gate>_> *gates)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  pointer pWVar6;
  pointer pGVar7;
  pointer pPVar8;
  Pheromone PVar9;
  Pheromone PVar10;
  ulong uVar11;
  Wall *wall;
  pointer pWVar12;
  int *piVar13;
  pointer pPVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  pointer pGVar19;
  double dVar20;
  double dVar21;
  
  iVar1 = this->x;
  uVar2 = this->y;
  uVar11 = (ulong)uVar2;
  pWVar12 = (walls->super__Vector_base<Wall,_std::allocator<Wall>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  pWVar6 = (walls->super__Vector_base<Wall,_std::allocator<Wall>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pWVar12 == pWVar6) {
    iVar17 = -999999;
    iVar16 = 999999;
    uVar15 = 999999;
    uVar18 = 0xfff0bdc1;
  }
  else {
    uVar15 = 999999;
    uVar18 = 0xfff0bdc1;
    iVar17 = -999999;
    iVar16 = 999999;
    do {
      iVar3 = pWVar12->x;
      uVar4 = pWVar12->y;
      if (iVar3 == iVar1) {
        if ((int)uVar2 < (int)uVar4) {
          if ((int)uVar4 <= (int)uVar15) {
            uVar15 = uVar4;
          }
        }
        else if (((int)uVar4 < (int)uVar2) && ((int)uVar18 < (int)uVar4)) {
          uVar18 = uVar4;
        }
      }
      else if (uVar4 == uVar2) {
        if (iVar1 < iVar3) {
          if (iVar3 <= iVar16) {
            iVar16 = iVar3;
          }
        }
        else if ((iVar3 < iVar1) && (iVar17 < iVar3)) {
          iVar17 = iVar3;
        }
      }
      pWVar12 = pWVar12 + 1;
    } while (pWVar12 != pWVar6);
  }
  pGVar19 = (gates->super__Vector_base<Gate,_std::allocator<Gate>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  pGVar7 = (gates->super__Vector_base<Gate,_std::allocator<Gate>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pGVar19 != pGVar7) {
    piVar13 = &pGVar19->facing;
    do {
      iVar3 = ((Gate *)(piVar13 + -2))->x;
      uVar4 = piVar13[-1];
      if (iVar3 == iVar1) {
        if (*piVar13 == 1 && (int)uVar2 < (int)uVar4) {
          if ((int)uVar4 <= (int)uVar15) {
            uVar15 = uVar4;
          }
        }
        else if ((*piVar13 == 3 && (int)uVar4 < (int)uVar2) && ((int)uVar18 < (int)uVar4)) {
          uVar18 = uVar4;
        }
      }
      else if (uVar4 == uVar2) {
        if (*piVar13 == 0 && iVar1 < iVar3) {
          if (iVar3 <= iVar16) {
            iVar16 = iVar3;
          }
        }
        else if ((*piVar13 == 2 && iVar3 < iVar1) && (iVar17 < iVar3)) {
          iVar17 = iVar3;
        }
      }
      pGVar19 = (pointer)(piVar13 + 1);
      piVar13 = piVar13 + 3;
    } while (pGVar19 != pGVar7);
  }
  PVar9.y = 0;
  PVar9.x = iVar1 - 1U;
  pPVar14 = (pheromones->super__Vector_base<Pheromone,_std::allocator<Pheromone>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar8 = (pheromones->super__Vector_base<Pheromone,_std::allocator<Pheromone>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar14 == pPVar8) {
    PVar10.y = uVar2;
    PVar10.x = iVar1 - 1U;
    this->t = PVar10;
    iVar16 = 0;
  }
  else {
    dVar20 = 999999.0;
    do {
      iVar3 = pPVar14->x;
      iVar5 = pPVar14->y;
      dVar21 = SQRT((double)(int)(iVar5 - uVar2) * (double)(int)(iVar5 - uVar2) +
                    (double)(iVar3 - iVar1) * (double)(iVar3 - iVar1));
      if (((((0.0 < dVar21) && (dVar21 < dVar20)) && ((int)uVar18 < iVar5)) &&
          ((iVar5 < (int)uVar15 && (iVar17 < iVar3)))) && (iVar3 < iVar16)) {
        PVar9 = *pPVar14;
        uVar11 = (ulong)PVar9 >> 0x20;
        dVar20 = dVar21;
      }
      pPVar14 = pPVar14 + 1;
    } while (pPVar14 != pPVar8);
    this->t = (Pheromone)((ulong)PVar9 & 0xffffffff | uVar11 << 0x20);
    iVar16 = 0;
    if (iVar1 <= PVar9.x) {
      iVar16 = 1;
      if ((((int)uVar2 <= (int)uVar11) && (iVar16 = 2, PVar9.x <= iVar1)) &&
         (iVar16 = 3, (int)uVar11 <= (int)uVar2)) {
        return this;
      }
    }
  }
  this->direction = iVar16;
  return this;
}

Assistant:

Ant& updatePh(const vector<Wall> & walls, const vector<Pheromone> & pheromones, const vector<Gate> & gates) {
            int upperBound = -999999; int lowerBound = 999999;
            int leftBound = -999999; int rightBound = 999999;

            Pheromone target(x - 1, y);
            double bestDist = 999999;

            for (const Wall & wall : walls) {
                if (wall.x == x) {
                    if (wall.y > y)
                        lowerBound = min(wall.y, lowerBound);
                    else if (wall.y < y)
                        upperBound = max(wall.y, upperBound);
                } else if (wall.y == y) {
                    if (wall.x > x)
                        rightBound = min(wall.x, rightBound);
                    else if (wall.x < x)
                        leftBound = max(wall.x, leftBound);
                }
            }

            for (const Gate & gate : gates) {
                if (gate.x == x) {
                    if (gate.y > y && gate.facing == 1)
                        lowerBound = min(gate.y, lowerBound);
                    else if (gate.y < y && gate.facing == 3)
                        upperBound = max(gate.y, upperBound);
                } else if (gate.y == y) {
                    if (gate.x > x && gate.facing == 0)
                        rightBound = min(gate.x, rightBound);
                    else if (gate.x < x && gate.facing == 2)
                        leftBound = max(gate.x, leftBound);
                }
            }

            for (const Pheromone & pher : pheromones) {
                double d = dist({ pher.x, pher.y }, { x, y });
                if (0 < d && d < bestDist &&
                        upperBound < pher.y && pher.y < lowerBound &&
                        leftBound < pher.x && pher.x < rightBound) {
                    bestDist = d;
                    target = pher;
                }
            }

            this -> t = target;

            if (target.x < x)
                setFacing(0);
            else if (target.y < y)
                setFacing(1);
            else if (x < target.x)
                setFacing(2);
            else if (y < target.y)
                setFacing(3);

            return *this;
        }